

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall
HighsMipSolverData::finishSymmetryDetection
          (HighsMipSolverData *this,TaskGroup *taskGroup,
          unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
          *symData)

{
  pointer pHVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  HighsLogOptions *log_options_;
  HighsOrbitopeMatrix *orbitope;
  pointer this_01;
  string symmetry_time;
  undefined1 local_58 [16];
  string local_48;
  
  ::highs::parallel::TaskGroup::sync(taskGroup);
  HighsSymmetries::operator=
            (&this->symmetries,
             &((symData->_M_t).
               super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
               .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>.
              _M_head_impl)->symmetries);
  if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).timeless_log == true) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 0x10),"");
  }
  else {
    highsFormatToString_abi_cxx11_
              ((string *)(local_58 + 0x10)," %.1fs",
               SUB84(((symData->_M_t).
                      super___uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                      .super__Head_base<0UL,_HighsMipSolverData::SymmetryDetectionData_*,_false>.
                     _M_head_impl)->detectionTime,0));
  }
  highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "\nSymmetry detection completed in%s\n",local_48._M_dataplus._M_p);
  if ((this->symmetries).numGenerators == 0) {
    this->detectSymmetries = false;
    highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "No symmetry present\n\n");
  }
  else {
    uVar4 = (long)(this->symmetries).orbitopes.
                  super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->symmetries).orbitopes.
                  super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                   "Found %d generator(s)\n\n");
    }
    else {
      log_options_ = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options;
      if ((this->symmetries).numPerms == 0) {
        highsLogUser(log_options_,kInfo,"Found %d full orbitope(s) acting on %d columns\n\n",
                     (ulong)(uint)((int)(uVar4 >> 3) * -0x3b13b13b),
                     (ulong)(uint)(this->symmetries).columnToOrbitope.numElements);
      }
      else {
        highsLogUser(log_options_,kInfo,
                     "Found %d generator(s) and %d full orbitope(s) acting on %d columns\n\n");
      }
    }
  }
  std::
  __uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
  ::reset((__uniq_ptr_impl<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
           *)symData,(pointer)0x0);
  this_01 = (this->symmetries).orbitopes.
            super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar1 = (this->symmetries).orbitopes.
           super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_01 != pHVar1) {
    do {
      HighsOrbitopeMatrix::determineOrbitopeType(this_01,&this->cliquetable);
      this_01 = this_01 + 1;
    } while (this_01 != pHVar1);
  }
  if ((this->symmetries).numPerms != 0) {
    HighsSymmetries::computeStabilizerOrbits
              ((HighsSymmetries *)local_58,(HighsDomain *)&this->symmetries);
    uVar3 = local_58._8_8_;
    uVar2 = local_58._0_8_;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->globalOrbits).
              super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->globalOrbits).super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar2;
    (this->globalOrbits).super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HighsMipSolverData::finishSymmetryDetection(
    const highs::parallel::TaskGroup& taskGroup,
    std::unique_ptr<SymmetryDetectionData>& symData) {
  taskGroup.sync();

  symmetries = std::move(symData->symmetries);
  std::string symmetry_time =
      mipsolver.options_mip_->timeless_log
          ? ""
          : highsFormatToString(" %.1fs", symData->detectionTime);
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "\nSymmetry detection completed in%s\n", symmetry_time.c_str());

  if (symmetries.numGenerators == 0) {
    detectSymmetries = false;
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "No symmetry present\n\n");
  } else if (symmetries.orbitopes.size() == 0) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Found %d generator(s)\n\n", int(symmetries.numGenerators));

  } else {
    if (symmetries.numPerms != 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d generator(s) and %d full orbitope(s) acting on %d "
                   "columns\n\n",
                   int(symmetries.numPerms), int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    } else {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d full orbitope(s) acting on %d columns\n\n",
                   int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    }
  }
  symData.reset();

  for (HighsOrbitopeMatrix& orbitope : symmetries.orbitopes)
    orbitope.determineOrbitopeType(cliquetable);

  if (symmetries.numPerms != 0)
    globalOrbits = symmetries.computeStabilizerOrbits(domain);
}